

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

Matrix33d * gmath::createSkewSymmetric(Matrix33d *__return_storage_ptr__,Vector3d *a)

{
  double dVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  
  SMatrix<double,_3,_3>::SMatrix(__return_storage_ptr__);
  __return_storage_ptr__->v[0][0] = 0.0;
  dVar1 = a->v[2];
  __return_storage_ptr__->v[0][1] = -dVar1;
  __return_storage_ptr__->v[1][0] = dVar1;
  __return_storage_ptr__->v[1][1] = 0.0;
  uVar2 = *(undefined4 *)a->v;
  uVar3 = *(uint *)((long)a->v + 4);
  uVar4 = *(undefined4 *)(a->v + 1);
  uVar5 = *(uint *)((long)a->v + 0xc);
  *(undefined4 *)__return_storage_ptr__->v[1] = uVar4;
  *(uint *)((long)__return_storage_ptr__->v[1] + 4) = uVar5;
  *(undefined4 *)(__return_storage_ptr__->v[1] + 2) = uVar2;
  *(uint *)((long)__return_storage_ptr__->v[1] + 0x14) = uVar3 ^ 0x80000000;
  *(undefined4 *)__return_storage_ptr__->v[2] = uVar4;
  *(uint *)((long)__return_storage_ptr__->v[2] + 4) = uVar5 ^ 0x80000000;
  *(undefined4 *)(__return_storage_ptr__->v[2] + 1) = uVar2;
  *(uint *)((long)__return_storage_ptr__->v[2] + 0xc) = uVar3;
  __return_storage_ptr__->v[2][2] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

inline Matrix33d createSkewSymmetric(const Vector3d &a)
{
  Matrix33d S;

  S(0, 0)=0;     S(0, 1)=-a[2]; S(0, 2)=a[1];
  S(1, 0)=a[2];  S(1, 1)=0;     S(1, 2)=-a[0];
  S(2, 0)=-a[1]; S(2, 1)=a[0];  S(2, 2)=0;

  return S;
}